

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O0

void TransformDC_C(int16_t *in,uint8_t *dst)

{
  short sVar1;
  uint8_t uVar2;
  long in_RSI;
  short *in_RDI;
  int j;
  int i;
  int DC;
  undefined4 local_1c;
  undefined4 local_18;
  
  sVar1 = *in_RDI;
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
      uVar2 = clip_8b((uint)*(byte *)(in_RSI + (local_18 + local_1c * 0x20)) + (sVar1 + 4 >> 3));
      *(uint8_t *)(in_RSI + (local_18 + local_1c * 0x20)) = uVar2;
    }
  }
  return;
}

Assistant:

static void TransformDC_C(const int16_t* WEBP_RESTRICT in,
                          uint8_t* WEBP_RESTRICT dst) {
  const int DC = in[0] + 4;
  int i, j;
  for (j = 0; j < 4; ++j) {
    for (i = 0; i < 4; ++i) {
      STORE(i, j, DC);
    }
  }
}